

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void calculate_gf_length(AV1_COMP *cpi,int max_gop_length,int max_intervals)

{
  int *piVar1;
  aom_enc_pass aVar2;
  int f_w;
  int f_h;
  int iVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  FIRSTPASS_STATS *pFVar6;
  AV1_PRIMARY *pAVar7;
  STATS_BUFFER_CTX *pSVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  byte bVar13;
  bool bVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  REGION_TYPES *pRVar19;
  int iVar20;
  int iVar21;
  uint cur_idx;
  FIRSTPASS_STATS *pFVar22;
  FIRSTPASS_STATS *pFVar23;
  ulong uVar24;
  int k;
  int iVar25;
  FIRSTPASS_STATS *pFVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  int cut_pos [16];
  int local_268;
  ulong local_240;
  GF_GROUP_STATS local_1e8;
  uint local_158 [16];
  FIRSTPASS_STATS local_118;
  
  pAVar5 = cpi->ppi;
  iVar11 = (cpi->rc).frames_since_key;
  bVar33 = iVar11 == 0;
  aVar2 = (cpi->oxcf).pass;
  if (aVar2 == AOM_RC_ONE_PASS && pAVar5->lap_enabled == 0) {
    lVar28 = 0;
    do {
      iVar11 = (cpi->rc).max_gf_interval;
      if (max_gop_length <= iVar11) {
        iVar11 = max_gop_length;
      }
      (pAVar5->p_rc).gf_intervals[lVar28] = iVar11;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0xf);
    (pAVar5->p_rc).cur_gf_index = 0;
    (cpi->rc).intervals_till_gf_calculate_due = 0xf;
    return;
  }
  pFVar6 = (cpi->twopass_frame).stats_in;
  f_w = (cpi->common).width;
  f_h = (cpi->common).height;
  iVar3 = (cpi->rc).min_gf_interval;
  iVar20 = (cpi->rc).max_gf_interval;
  if (iVar20 < max_gop_length) {
    max_gop_length = iVar20;
  }
  iVar20 = 6;
  if (6 < iVar3) {
    iVar20 = iVar3;
  }
  local_158[2] = 0;
  local_158[3] = 0;
  local_158[0xc] = 0;
  local_158[0xd] = 0;
  local_158[0xe] = 0;
  local_158[0xf] = 0;
  local_158[8] = 0;
  local_158[9] = 0;
  local_158[10] = 0;
  local_158[0xb] = 0;
  local_158[4] = 0;
  local_158[5] = 0;
  local_158[6] = 0;
  local_158[7] = 0;
  local_158[0] = 0xffffffff;
  local_158[1] = 0;
  local_1e8.gf_group_skip_pct = 0.0;
  local_1e8.gf_group_inactive_zone_rows = 0.0;
  local_1e8.gf_group_err = 0.0;
  local_1e8.gf_group_raw_error = 0.0;
  local_1e8.mv_ratio_accumulator = 0.0;
  local_1e8.decay_accumulator._0_4_ = 0;
  local_1e8.decay_accumulator._4_4_ = 0x3ff00000;
  local_1e8.zero_motion_accumulator._0_4_ = 0;
  local_1e8.zero_motion_accumulator._4_4_ = 0x3ff00000;
  local_1e8.loop_decay_rate._0_4_ = 0;
  local_1e8.loop_decay_rate._4_4_ = 0x3ff00000;
  local_1e8.last_loop_decay_rate._0_4_ = 0;
  local_1e8.last_loop_decay_rate._4_4_ = 0x3ff00000;
  local_1e8.this_frame_mv_in_out = 0.0;
  local_1e8.mv_in_out_accumulator = 0.0;
  local_1e8.abs_mv_in_out_accumulator = 0.0;
  local_1e8.avg_sr_coded_error = 0.0;
  local_1e8.avg_pcnt_second_ref = 0.0;
  local_1e8.avg_new_mv_count = 0.0;
  local_1e8.avg_wavelet_energy = 0.0;
  local_1e8.avg_raw_err_stdev = 0.0;
  local_1e8.non_zero_stdev_count = 0;
  local_268 = 2;
  if (aVar2 != AOM_RC_ONE_PASS && pAVar5->lap_enabled == 0) {
    if (max_intervals < 1) {
      (cpi->rc).intervals_till_gf_calculate_due = 0;
      goto LAB_001f4ac6;
    }
    local_268 = max_intervals + 1;
  }
  cur_idx = (uint)(iVar11 == 0);
  uVar16 = -(uint)((pAVar5->gf_state).arf_gf_boost_lst != 0);
  piVar1 = &(pAVar5->p_rc).regions[0].last;
  uVar18 = 1;
LAB_001f4185:
  bVar13 = 1;
  if ((cpi->rc).frames_to_key <= (int)cur_idx) {
LAB_001f430c:
    uVar31 = cur_idx - 1;
    lVar28 = (long)(cpi->rc).frames_since_key - (long)(pAVar5->p_rc).regions_offset;
    uVar27 = (pAVar5->p_rc).num_regions;
    uVar17 = (ulong)uVar27;
    iVar11 = (int)lVar28;
    uVar30 = uVar31;
    if (((int)uVar16 < (int)uVar31) && ((int)(uVar31 - uVar16) <= max_gop_length)) {
      iVar21 = iVar11 + uVar16;
      if ((int)uVar27 < 1) {
        iVar9 = -1;
      }
      else {
        uVar24 = 0;
        piVar12 = piVar1;
        do {
          if ((((REGIONS *)(piVar12 + -1))->start <= iVar21) && (iVar21 <= *piVar12))
          goto LAB_001f4383;
          uVar24 = uVar24 + 1;
          piVar12 = piVar12 + 0xe;
        } while (uVar17 != uVar24);
        uVar24 = 0xffffffff;
LAB_001f4383:
        iVar9 = (int)uVar24;
        uVar24 = 0;
        piVar12 = piVar1;
        do {
          if ((((REGIONS *)(piVar12 + -1))->start <= (int)(iVar11 + uVar31)) &&
             ((int)(iVar11 + uVar31) <= *piVar12)) goto LAB_001f43bb;
          uVar24 = uVar24 + 1;
          piVar12 = piVar12 + 0xe;
        } while (uVar17 != uVar24);
      }
      uVar24 = 0xffffffff;
LAB_001f43bb:
      if (iVar21 == 0) {
        iVar9 = 0;
      }
      iVar10 = -1;
      iVar25 = (int)uVar24;
      lVar29 = (long)iVar9;
      if (iVar9 < iVar25) {
        pRVar19 = &(pAVar5->p_rc).regions[lVar29 + 1].type;
        lVar15 = 0;
        do {
          if ((*pRVar19 == SCENECUT_REGION) && (iVar3 < (int)(pRVar19[-0xb] - iVar21))) {
            iVar10 = (iVar9 - (int)lVar15) + 1;
            break;
          }
          lVar15 = lVar15 + -1;
          pRVar19 = pRVar19 + 0xe;
        } while (lVar29 - iVar25 != lVar15);
      }
      iVar21 = (pAVar5->p_rc).regions[(long)(int)uVar27 + -1].last;
      if (iVar10 != -1) {
        iVar4 = (pAVar5->p_rc).regions[iVar10].last;
        if (3 < iVar21 - iVar4) {
          uVar30 = (iVar4 - iVar11) -
                   (uint)((1.0 - pFVar6[((pAVar5->p_rc).regions[iVar10].start - lVar28) -
                                        (ulong)bVar33].noise_var /
                                 (pAVar5->p_rc).regions[iVar10].avg_intra_err) *
                          (pAVar5->p_rc).regions[iVar10].avg_cor_coeff <= 0.6);
          goto LAB_001f4817;
        }
      }
      if (iVar25 == uVar27 - 1) {
        bVar34 = iVar11 + uVar31 == (pAVar5->p_rc).regions[iVar25].last;
      }
      else {
        bVar34 = false;
      }
      if ((bVar34) &&
         (iVar25 - iVar9 <= (int)(((pAVar5->p_rc).regions[lVar29].type == SCENECUT_REGION) + 1)))
      goto LAB_001f4817;
      iVar9 = (pAVar5->p_rc).regions[0].start - iVar11;
      iVar21 = iVar21 - iVar11;
      pSVar8 = (pAVar5->twopass).stats_buf_ctx;
      lVar28 = (long)(int)(uVar16 + 1);
      uVar24 = (ulong)(int)(iVar20 + uVar16);
      pFVar23 = pFVar6 + (lVar28 - (ulong)bVar33);
      dVar35 = 0.0;
      do {
        if (pSVar8->stats_in_end <= pFVar23) break;
        dVar35 = (dVar35 + 1.0) * pFVar23->cor_coeff;
        lVar28 = lVar28 + 1;
        pFVar23 = pFVar23 + 1;
      } while (lVar28 < (long)uVar24);
      bVar34 = false;
      if ((int)(iVar20 + uVar16) < (int)cur_idx) {
        bVar34 = false;
        pFVar23 = pFVar6 + ((uVar24 + 1) - (ulong)bVar33);
        pFVar22 = pFVar6 + (uVar24 - bVar33);
        dVar36 = 0.0;
        local_240 = 0xffffffff;
        bVar14 = false;
LAB_001f45be:
        if (pFVar6 + (uVar24 - bVar33) < pSVar8->stats_in_end) {
          dVar35 = (dVar35 + 1.0) * pFVar6[uVar24 - bVar33].cor_coeff;
          if (0 < (int)uVar27) {
            iVar10 = (int)uVar24;
            lVar28 = 0;
            do {
              if ((*(int *)((long)&(pAVar5->p_rc).regions[0].start + lVar28) <= iVar11 + iVar10) &&
                 (iVar11 + iVar10 <= *(int *)((long)&(pAVar5->p_rc).regions[0].last + lVar28))) {
                if (*(int *)((long)&(pAVar5->p_rc).regions[0].type + lVar28) != 3) {
                  if (bVar34) {
                    bVar14 = true;
                  }
                  dVar37 = dVar35 * 0.1;
                  lVar28 = 0;
                  if ((long)iVar21 <= (long)uVar24) goto LAB_001f46dd;
                  iVar25 = iVar10 + 3;
                  if (iVar21 <= iVar10 + 3) {
                    iVar25 = iVar21;
                  }
                  lVar28 = 0;
                  dVar38 = 1.0;
                  pFVar26 = pFVar23;
                  goto LAB_001f4680;
                }
                if (bVar14) goto LAB_001f47a4;
                bVar34 = true;
                bVar14 = false;
                dVar35 = 0.0;
                break;
              }
              lVar28 = lVar28 + 0x38;
            } while (uVar17 * 0x38 - lVar28 != 0);
          }
          goto LAB_001f478d;
        }
        goto LAB_001f47a4;
      }
      local_240._0_4_ = 0xffffffff;
      goto LAB_001f47c6;
    }
    goto LAB_001f4817;
  }
  uVar27 = cur_idx - uVar16;
  if ((cpi->rc).static_scene_max_gf_interval <= (int)uVar27) {
LAB_001f430a:
    bVar13 = 0;
    goto LAB_001f430c;
  }
  pFVar23 = ((pAVar5->twopass).stats_buf_ctx)->stats_in_end;
  pFVar22 = (cpi->twopass_frame).stats_in;
  if (pFVar23 <= pFVar22) goto LAB_001f430c;
  memcpy(&local_118,pFVar22,0xe8);
  pFVar26 = pFVar22 + 1;
  (cpi->twopass_frame).stats_in = pFVar26;
  if (pFVar26 < pFVar23) {
    dVar35 = pFVar22[1].pcnt_second_ref;
    uVar30 = 0;
    if (pFVar22[1].pcnt_inter <= dVar35 && dVar35 != pFVar22[1].pcnt_inter) {
      uVar30 = (uint)(0.5 <= dVar35);
    }
  }
  else {
    uVar30 = 0;
  }
  accumulate_next_frame_stats
            (&local_118,uVar30,(cpi->rc).frames_since_key,cur_idx,&local_1e8,f_w,f_h);
  pAVar7 = cpi->ppi;
  iVar11 = (cpi->common).width;
  iVar21 = (cpi->common).height;
  if ((uVar30 == 0) &&
     (iVar9 = detect_transition_to_still
                        (&(pAVar7->twopass).firstpass_info,
                         (int)((ulong)((long)pFVar26 -
                                      (long)((pAVar7->twopass).stats_buf_ctx)->stats_in_start) >> 3)
                         * 0x4f72c235,(cpi->rc).min_gf_interval,uVar27,5,
                         (double)CONCAT44(local_1e8.loop_decay_rate._4_4_,
                                          local_1e8.loop_decay_rate._0_4_),
                         (double)CONCAT44(local_1e8.last_loop_decay_rate._4_4_,
                                          local_1e8.last_loop_decay_rate._0_4_)), iVar9 != 0)) {
    bVar13 = 0;
    goto LAB_001f430c;
  }
  if ((((iVar3 <= (int)uVar27) &&
       ((cpi->rc).min_gf_interval <= (int)((cpi->rc).frames_to_key - cur_idx))) &&
      ((uVar27 & 1) != 0)) && (uVar30 == 0)) {
    bVar13 = 0;
    if (((double)(iVar11 + iVar21) * 0.25 < local_1e8.mv_ratio_accumulator) ||
       (bVar13 = 0, 4.4 < local_1e8.abs_mv_in_out_accumulator)) goto LAB_001f430c;
  }
  if (max_gop_length < (int)uVar27) {
    if (cpi->ppi->lap_enabled == 0) {
      bVar13 = 0;
      if (((double)CONCAT44(local_1e8.zero_motion_accumulator._4_4_,
                            local_1e8.zero_motion_accumulator._0_4_) < 0.995) ||
         ((pAVar7->twopass).kf_zeromotion_pct < 99)) goto LAB_001f430c;
    }
    else if ((double)CONCAT44(local_1e8.zero_motion_accumulator._4_4_,
                              local_1e8.zero_motion_accumulator._0_4_) < 0.999) goto LAB_001f430a;
  }
  goto LAB_001f48d1;
  while( true ) {
    dVar38 = dVar38 * pFVar26->cor_coeff;
    dVar39 = pFVar26->intra_error;
    if (dVar39 <= 0.001) {
      dVar39 = 0.001;
    }
    dVar40 = 1.0 - pFVar26->noise_var / dVar39;
    dVar39 = 0.5;
    if (0.5 <= dVar40) {
      dVar39 = dVar40;
    }
    dVar37 = dVar37 + SQRT(dVar39) * dVar38;
    pFVar26 = pFVar26 + 1;
    lVar29 = uVar24 + lVar28;
    lVar28 = lVar28 + 1;
    if ((long)iVar25 <= lVar29 + 1) break;
LAB_001f4680:
    if (pSVar8->stats_in_end <= pFVar26) break;
  }
LAB_001f46dd:
  iVar10 = iVar10 + (int)lVar28 + -6;
  if (iVar10 <= iVar9) {
    iVar10 = iVar9;
  }
  if ((long)iVar10 < (long)uVar24) {
    dVar38 = 1.0;
    pFVar26 = pFVar22;
    uVar32 = uVar24;
    do {
      if (pFVar26 < pSVar8->stats_in_start) break;
      dVar38 = dVar38 * pFVar26->cor_coeff;
      dVar39 = pFVar26->intra_error;
      if (dVar39 <= 0.001) {
        dVar39 = 0.001;
      }
      dVar40 = 1.0 - pFVar26->noise_var / dVar39;
      dVar39 = 0.5;
      if (0.5 <= dVar40) {
        dVar39 = dVar40;
      }
      dVar37 = dVar37 + SQRT(dVar39) * dVar38;
      uVar32 = uVar32 - 1;
      pFVar26 = pFVar26 + -1;
    } while ((long)iVar10 < (long)uVar32);
  }
  if (dVar36 < dVar37) {
    local_240 = uVar24;
  }
  local_240 = local_240 & 0xffffffff;
  if (dVar37 <= dVar36) {
    dVar37 = dVar36;
  }
  dVar36 = dVar37;
  bVar34 = false;
LAB_001f478d:
  uVar24 = uVar24 + 1;
  pFVar23 = pFVar23 + 1;
  pFVar22 = pFVar22 + 1;
  if ((long)(int)cur_idx <= (long)uVar24) goto LAB_001f47a4;
  goto LAB_001f45be;
LAB_001f47a4:
  bVar34 = 0.1 < dVar36;
LAB_001f47c6:
  if (0 < (int)uVar27) {
    iVar21 = (uint)local_240 + iVar11;
    uVar24 = 0;
    pRVar19 = (REGION_TYPES *)&(pAVar5->p_rc).num_regions;
    do {
      if ((((REGIONS *)(pRVar19 + 2))->start <= iVar21) && (iVar21 <= (int)pRVar19[3])) {
        if ((uVar24 != 0) &&
           ((((int)uVar24 < (int)(uVar27 - 1) && (*pRVar19 == BLENDING_REGION)) &&
            (pRVar19[0x1c] == 3)))) {
          if ((iVar21 == pRVar19[2]) && (iVar21 < (int)pRVar19[3])) {
            local_240._0_4_ = (uint)local_240 + 1;
          }
          else if (iVar21 == pRVar19[3]) {
            local_240._0_4_ = (uint)local_240 - ((int)pRVar19[2] < iVar21);
          }
        }
        break;
      }
      uVar24 = uVar24 + 1;
      pRVar19 = pRVar19 + 0xe;
    } while (uVar17 != uVar24);
  }
  if ((int)(uVar31 - (uint)local_240) < 2) {
    local_240._0_4_ = uVar31;
  }
  if (bVar34) {
    uVar30 = (uint)local_240;
  }
  if ((int)(uint)local_240 < 1) {
    uVar30 = uVar31;
  }
LAB_001f4817:
  cur_idx = uVar30;
  local_158[(int)uVar18] = cur_idx;
  (cpi->twopass_frame).stats_in = pFVar6 + (int)cur_idx;
  uVar16 = cur_idx;
  if (0 < (int)uVar27) {
    iVar11 = cur_idx + iVar11 + 1;
    lVar28 = 0;
    do {
      if ((*(int *)((long)&(pAVar5->p_rc).regions[0].start + lVar28) <= iVar11) &&
         (iVar11 <= *(int *)((long)&(pAVar5->p_rc).regions[0].last + lVar28))) {
        uVar16 = cur_idx + 1;
        if (*(int *)((long)&(pAVar5->p_rc).regions[0].type + lVar28) != 2) {
          uVar16 = cur_idx;
        }
        break;
      }
      lVar28 = lVar28 + 0x38;
    } while (uVar17 * 0x38 - lVar28 != 0);
  }
  uVar18 = uVar18 + 1;
  if ((bool)(bVar13 & cur_idx == uVar31)) goto LAB_001f4a7f;
  local_1e8.gf_group_skip_pct = 0.0;
  local_1e8.gf_group_inactive_zone_rows = 0.0;
  local_1e8.gf_group_err = 0.0;
  local_1e8.gf_group_raw_error = 0.0;
  local_1e8.mv_ratio_accumulator = 0.0;
  local_1e8.decay_accumulator._0_4_ = 0;
  local_1e8.decay_accumulator._4_4_ = 0x3ff00000;
  local_1e8.zero_motion_accumulator._0_4_ = 0;
  local_1e8.zero_motion_accumulator._4_4_ = 0x3ff00000;
  local_1e8.loop_decay_rate._0_4_ = 0;
  local_1e8.loop_decay_rate._4_4_ = 0x3ff00000;
  local_1e8.last_loop_decay_rate._0_4_ = 0;
  local_1e8.last_loop_decay_rate._4_4_ = 0x3ff00000;
  local_1e8.avg_wavelet_energy = 0.0;
  local_1e8.avg_raw_err_stdev = 0.0;
  local_1e8.avg_pcnt_second_ref = 0.0;
  local_1e8.avg_new_mv_count = 0.0;
  local_1e8.abs_mv_in_out_accumulator = 0.0;
  local_1e8.avg_sr_coded_error = 0.0;
  local_1e8.this_frame_mv_in_out = 0.0;
  local_1e8.mv_in_out_accumulator = 0.0;
  local_1e8.non_zero_stdev_count = 0;
LAB_001f48d1:
  cur_idx = cur_idx + 1;
  if (local_268 <= (int)uVar18) goto LAB_001f4a7f;
  goto LAB_001f4185;
LAB_001f4a7f:
  (cpi->rc).intervals_till_gf_calculate_due = uVar18 - 1;
  if (1 < (int)uVar18) {
    lVar28 = 0;
    do {
      uVar16 = local_158[lVar28 + 1];
      (pAVar5->p_rc).gf_intervals[lVar28] = uVar16 - local_158[0];
      lVar28 = lVar28 + 1;
      local_158[0] = uVar16;
    } while ((ulong)uVar18 - 1 != lVar28);
  }
LAB_001f4ac6:
  (pAVar5->p_rc).cur_gf_index = 0;
  (cpi->twopass_frame).stats_in = pFVar6;
  return;
}

Assistant:

static void calculate_gf_length(AV1_COMP *cpi, int max_gop_length,
                                int max_intervals) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  const FIRSTPASS_STATS *const stats = start_pos - (rc->frames_since_key == 0);

  const int f_w = cpi->common.width;
  const int f_h = cpi->common.height;
  int i;

  int flash_detected;

  av1_zero(next_frame);

  if (has_no_stats_stage(cpi)) {
    for (i = 0; i < MAX_NUM_GF_INTERVALS; i++) {
      p_rc->gf_intervals[i] = AOMMIN(rc->max_gf_interval, max_gop_length);
    }
    p_rc->cur_gf_index = 0;
    rc->intervals_till_gf_calculate_due = MAX_NUM_GF_INTERVALS;
    return;
  }

  // TODO(urvang): Try logic to vary min and max interval based on q.
  const int active_min_gf_interval = rc->min_gf_interval;
  const int active_max_gf_interval =
      AOMMIN(rc->max_gf_interval, max_gop_length);
  const int min_shrink_int = AOMMAX(MIN_SHRINK_LEN, active_min_gf_interval);

  i = (rc->frames_since_key == 0);
  max_intervals = cpi->ppi->lap_enabled ? 1 : max_intervals;
  int count_cuts = 1;
  // If cpi->gf_state.arf_gf_boost_lst is 0, we are starting with a KF or GF.
  int cur_start = -1 + !cpi->ppi->gf_state.arf_gf_boost_lst, cur_last;
  int cut_pos[MAX_NUM_GF_INTERVALS + 1] = { -1 };
  int cut_here;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  while (count_cuts < max_intervals + 1) {
    // reaches next key frame, break here
    if (i >= rc->frames_to_key) {
      cut_here = 2;
    } else if (i - cur_start >= rc->static_scene_max_gf_interval) {
      // reached maximum len, but nothing special yet (almost static)
      // let's look at the next interval
      cut_here = 1;
    } else if (EOF == input_stats(twopass, &cpi->twopass_frame, &next_frame)) {
      // reaches last frame, break
      cut_here = 2;
    } else {
      // Test for the case where there is a brief flash but the prediction
      // quality back to an earlier frame is then restored.
      flash_detected = detect_flash(twopass, &cpi->twopass_frame, 0);
      // TODO(bohanli): remove redundant accumulations here, or unify
      // this and the ones in define_gf_group
      accumulate_next_frame_stats(&next_frame, flash_detected,
                                  rc->frames_since_key, i, &gf_stats, f_w, f_h);

      cut_here = detect_gf_cut(cpi, i, cur_start, flash_detected,
                               active_max_gf_interval, active_min_gf_interval,
                               &gf_stats);
    }
    if (cut_here) {
      cur_last = i - 1;  // the current last frame in the gf group
      int ori_last = cur_last;
      // The region frame idx does not start from the same frame as cur_start
      // and cur_last. Need to offset them.
      int offset = rc->frames_since_key - p_rc->regions_offset;
      REGIONS *regions = p_rc->regions;
      int num_regions = p_rc->num_regions;

      int scenecut_idx = -1;
      // only try shrinking if interval smaller than active_max_gf_interval
      if (cur_last - cur_start <= active_max_gf_interval &&
          cur_last > cur_start) {
        // find the region indices of where the first and last frame belong.
        int k_start =
            find_regions_index(regions, num_regions, cur_start + offset);
        int k_last =
            find_regions_index(regions, num_regions, cur_last + offset);
        if (cur_start + offset == 0) k_start = 0;

        // See if we have a scenecut in between
        for (int r = k_start + 1; r <= k_last; r++) {
          if (regions[r].type == SCENECUT_REGION &&
              regions[r].last - offset - cur_start > active_min_gf_interval) {
            scenecut_idx = r;
            break;
          }
        }

        // if the found scenecut is very close to the end, ignore it.
        if (regions[num_regions - 1].last - regions[scenecut_idx].last < 4) {
          scenecut_idx = -1;
        }

        if (scenecut_idx != -1) {
          // If we have a scenecut, then stop at it.
          // TODO(bohanli): add logic here to stop before the scenecut and for
          // the next gop start from the scenecut with GF
          int is_minor_sc =
              (regions[scenecut_idx].avg_cor_coeff *
                   (1 - stats[regions[scenecut_idx].start - offset].noise_var /
                            regions[scenecut_idx].avg_intra_err) >
               0.6);
          cur_last = regions[scenecut_idx].last - offset - !is_minor_sc;
        } else {
          int is_last_analysed = (k_last == num_regions - 1) &&
                                 (cur_last + offset == regions[k_last].last);
          int not_enough_regions =
              k_last - k_start <=
              1 + (regions[k_start].type == SCENECUT_REGION);
          // if we are very close to the end, then do not shrink since it may
          // introduce intervals that are too short
          if (!(is_last_analysed && not_enough_regions)) {
            const double arf_length_factor = 0.1;
            double best_score = 0;
            int best_j = -1;
            const int first_frame = regions[0].start - offset;
            const int last_frame = regions[num_regions - 1].last - offset;
            // score of how much the arf helps the whole GOP
            double base_score = 0.0;
            // Accumulate base_score in
            for (int j = cur_start + 1; j < cur_start + min_shrink_int; j++) {
              if (stats + j >= twopass->stats_buf_ctx->stats_in_end) break;
              base_score = (base_score + 1.0) * stats[j].cor_coeff;
            }
            int met_blending = 0;   // Whether we have met blending areas before
            int last_blending = 0;  // Whether the previous frame if blending
            for (int j = cur_start + min_shrink_int; j <= cur_last; j++) {
              if (stats + j >= twopass->stats_buf_ctx->stats_in_end) break;
              base_score = (base_score + 1.0) * stats[j].cor_coeff;
              int this_reg =
                  find_regions_index(regions, num_regions, j + offset);
              if (this_reg < 0) continue;
              // A GOP should include at most 1 blending region.
              if (regions[this_reg].type == BLENDING_REGION) {
                last_blending = 1;
                if (met_blending) {
                  break;
                } else {
                  base_score = 0;
                  continue;
                }
              } else {
                if (last_blending) met_blending = 1;
                last_blending = 0;
              }

              // Add the factor of how good the neighborhood is for this
              // candidate arf.
              double this_score = arf_length_factor * base_score;
              double temp_accu_coeff = 1.0;
              // following frames
              int count_f = 0;
              for (int n = j + 1; n <= j + 3 && n <= last_frame; n++) {
                if (stats + n >= twopass->stats_buf_ctx->stats_in_end) break;
                temp_accu_coeff *= stats[n].cor_coeff;
                this_score +=
                    temp_accu_coeff *
                    sqrt(AOMMAX(0.5,
                                1 - stats[n].noise_var /
                                        AOMMAX(stats[n].intra_error, 0.001)));
                count_f++;
              }
              // preceding frames
              temp_accu_coeff = 1.0;
              for (int n = j; n > j - 3 * 2 + count_f && n > first_frame; n--) {
                if (stats + n < twopass->stats_buf_ctx->stats_in_start) break;
                temp_accu_coeff *= stats[n].cor_coeff;
                this_score +=
                    temp_accu_coeff *
                    sqrt(AOMMAX(0.5,
                                1 - stats[n].noise_var /
                                        AOMMAX(stats[n].intra_error, 0.001)));
              }

              if (this_score > best_score) {
                best_score = this_score;
                best_j = j;
              }
            }

            // For blending areas, move one more frame in case we missed the
            // first blending frame.
            int best_reg =
                find_regions_index(regions, num_regions, best_j + offset);
            if (best_reg < num_regions - 1 && best_reg > 0) {
              if (regions[best_reg - 1].type == BLENDING_REGION &&
                  regions[best_reg + 1].type == BLENDING_REGION) {
                if (best_j + offset == regions[best_reg].start &&
                    best_j + offset < regions[best_reg].last) {
                  best_j += 1;
                } else if (best_j + offset == regions[best_reg].last &&
                           best_j + offset > regions[best_reg].start) {
                  best_j -= 1;
                }
              }
            }

            if (cur_last - best_j < 2) best_j = cur_last;
            if (best_j > 0 && best_score > 0.1) cur_last = best_j;
            // if cannot find anything, just cut at the original place.
          }
        }
      }
      cut_pos[count_cuts] = cur_last;
      count_cuts++;

      // reset pointers to the shrunken location
      cpi->twopass_frame.stats_in = start_pos + cur_last;
      cur_start = cur_last;
      int cur_region_idx =
          find_regions_index(regions, num_regions, cur_start + 1 + offset);
      if (cur_region_idx >= 0)
        if (regions[cur_region_idx].type == SCENECUT_REGION) cur_start++;

      i = cur_last;

      if (cut_here > 1 && cur_last == ori_last) break;

      // reset accumulators
      init_gf_stats(&gf_stats);
    }
    ++i;
  }

  // save intervals
  rc->intervals_till_gf_calculate_due = count_cuts - 1;
  for (int n = 1; n < count_cuts; n++) {
    p_rc->gf_intervals[n - 1] = cut_pos[n] - cut_pos[n - 1];
  }
  p_rc->cur_gf_index = 0;
  cpi->twopass_frame.stats_in = start_pos;
}